

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

void __thiscall MidiApi::~MidiApi(MidiApi *this)

{
  code *pcVar1;
  MidiApi *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

MidiApi :: ~MidiApi( void )
{
}